

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

DOMDocumentFragment * __thiscall
xercesc_4_0::DOMRangeImpl::traverseCommonEndContainer
          (DOMRangeImpl *this,DOMNode *startAncestor,int how)

{
  int iVar1;
  undefined4 extraout_var;
  DOMNode *pDVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var_00;
  XMLSize_t XVar4;
  DOMNode *xferNode;
  DOMNode *sibling;
  int cnt;
  XMLSize_t startIdx;
  DOMNode *n;
  DOMDocumentFragment *frag;
  int how_local;
  DOMNode *startAncestor_local;
  DOMRangeImpl *this_local;
  
  n = (DOMNode *)0x0;
  if (how != 3) {
    iVar1 = (*(this->fDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
    n = (DOMNode *)CONCAT44(extraout_var,iVar1);
  }
  pDVar2 = traverseLeftBoundary(this,startAncestor,how);
  if (n != (DOMNode *)0x0) {
    (*n->_vptr_DOMNode[0x11])(n,pDVar2);
  }
  XVar3 = indexOf(this,startAncestor,this->fEndContainer);
  XVar4 = this->fEndOffset;
  iVar1 = (*startAncestor->_vptr_DOMNode[10])();
  startIdx = CONCAT44(extraout_var_00,iVar1);
  for (sibling._4_4_ = (int)XVar4 - ((int)XVar3 + 1); 0 < sibling._4_4_;
      sibling._4_4_ = sibling._4_4_ + -1) {
    XVar4 = (**(code **)(*(long *)startIdx + 0x50))();
    pDVar2 = traverseFullySelected(this,(DOMNode *)startIdx,how);
    if (n != (DOMNode *)0x0) {
      (*n->_vptr_DOMNode[0x11])(n,pDVar2);
    }
    startIdx = XVar4;
  }
  if (how != 2) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xb])(this,startAncestor);
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
  }
  return (DOMDocumentFragment *)n;
}

Assistant:

DOMDocumentFragment* DOMRangeImpl::traverseCommonEndContainer( DOMNode*startAncestor, int how )
{
    DOMDocumentFragment* frag = 0;
    if ( how!=DELETE_CONTENTS)
        frag = fDocument->createDocumentFragment();
    DOMNode* n = traverseLeftBoundary( startAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );
    XMLSize_t startIdx = indexOf( startAncestor, fEndContainer );
    ++startIdx;  // Because we already traversed it....

    int cnt = (int)fEndOffset - (int)startIdx;
    n = startAncestor->getNextSibling();
    while( cnt > 0 )
    {
        DOMNode* sibling = n->getNextSibling();
        DOMNode* xferNode = traverseFullySelected( n, how );
        if ( frag!=0 )
            frag->appendChild( xferNode );
        --cnt;
        n = sibling;
    }

    if ( how != CLONE_CONTENTS )
    {
        setStartAfter( startAncestor );
        collapse( true );
    }

    return frag;
}